

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_epoch.h
# Opt level: O2

void __thiscall FASTER::core::LightEpoch::Drain(LightEpoch *this,uint64_t nextEpoch)

{
  atomic<unsigned_int> *paVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  code *pcVar5;
  undefined8 uVar6;
  long lVar7;
  bool bVar8;
  
  ComputeNewSafeToReclaimEpoch(this,nextEpoch);
  paVar1 = &this->drain_count_;
  lVar7 = 0;
  do {
    if (lVar7 == 0x1800) {
      return;
    }
    uVar4 = *(ulong *)((long)&this->drain_list_[0].epoch.super___atomic_base<unsigned_long>._M_i +
                      lVar7);
    if (uVar4 <= (this->safe_to_reclaim_epoch).super___atomic_base<unsigned_long>._M_i) {
      puVar2 = (ulong *)((long)&this->drain_list_[0].epoch.super___atomic_base<unsigned_long>._M_i +
                        lVar7);
      LOCK();
      bVar8 = uVar4 == *puVar2;
      if (bVar8) {
        *puVar2 = 0xfffffffffffffffe;
      }
      UNLOCK();
      if (bVar8) {
        pcVar5 = *(code **)((long)&this->drain_list_[0].callback + lVar7);
        uVar6 = *(undefined8 *)((long)&this->drain_list_[0].context + lVar7);
        puVar3 = (undefined8 *)((long)&this->drain_list_[0].callback + lVar7);
        *puVar3 = 0;
        puVar3[1] = 0;
        LOCK();
        *(undefined8 *)
         ((long)&this->drain_list_[0].epoch.super___atomic_base<unsigned_long>._M_i + lVar7) =
             0xffffffffffffffff;
        UNLOCK();
        (*pcVar5)(uVar6);
        LOCK();
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
          return;
        }
      }
    }
    lVar7 = lVar7 + 0x18;
  } while( true );
}

Assistant:

void Drain(uint64_t nextEpoch) {
    ComputeNewSafeToReclaimEpoch(nextEpoch);
    for(uint32_t idx = 0; idx < kDrainListSize; ++idx) {
      uint64_t trigger_epoch = drain_list_[idx].epoch.load();
      if(trigger_epoch <= safe_to_reclaim_epoch) {
        if(drain_list_[idx].TryPop(trigger_epoch)) {
          if(--drain_count_ == 0) {
            break;
          }
        }
      }
    }
  }